

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O0

bool __thiscall
CTtMappingMeshInfoUserData::Read(CTtMappingMeshInfoUserData *this,ON_BinaryArchive *binary_archive)

{
  bool bVar1;
  ON__INT32 local_30;
  int local_2c;
  int value;
  int i;
  int nCount;
  int nVersion;
  ON_BinaryArchive *binary_archive_local;
  CTtMappingMeshInfoUserData *this_local;
  
  i = 1;
  _nCount = binary_archive;
  binary_archive_local = (ON_BinaryArchive *)this;
  bVar1 = ON_BinaryArchive::ReadInt(binary_archive,&i);
  if (bVar1) {
    if (i == 1) {
      bVar1 = ON_GeometryFingerprint::Read(&(this->m_info).m_geometryFingerprint,_nCount);
      if (bVar1) {
        value = 0;
        bVar1 = ON_BinaryArchive::ReadInt(_nCount,&value);
        if (bVar1) {
          ON_SimpleArray<int>::SetCapacity(&(this->m_info).m_faceSourceIds,(long)value);
          for (local_2c = 0; local_2c < value; local_2c = local_2c + 1) {
            local_30 = -1;
            bVar1 = ON_BinaryArchive::ReadInt(_nCount,&local_30);
            if (!bVar1) {
              return false;
            }
            ON_SimpleArray<int>::Append(&(this->m_info).m_faceSourceIds,&local_30);
          }
          ON_MappingMeshInfo::GenerateDerivedData(&this->m_info);
          this_local._7_1_ = true;
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

virtual bool Read(ON_BinaryArchive& binary_archive)
  {
    if (!m_bArchive)
      return false;

    int nVersion = 1;

    if (!binary_archive.ReadInt(&nVersion))
      return false;

    if (1 != nVersion)
      return false;

    if (!m_info.m_geometryFingerprint.Read(binary_archive))
      return false;

    int nCount = 0;

    if (!binary_archive.ReadInt(&nCount))
      return false;

    m_info.m_faceSourceIds.SetCapacity(nCount);
    for (int i = 0; i < nCount; i++)
    {
      int value = -1;
      if (!binary_archive.ReadInt(&value))
        return false;
      m_info.m_faceSourceIds.Append(value);
    }

    m_info.GenerateDerivedData();

    return true;
  }